

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libntlmconnect.c
# Opt level: O3

int test(char *url)

{
  uint uVar1;
  CURL **ppCVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  CURL *pCVar10;
  ulong uVar11;
  undefined8 uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  char cVar16;
  char cVar17;
  timeval tVar18;
  curl_socket_t maxfd;
  int running;
  long timeout;
  timeval interval;
  fd_set fdread;
  fd_set fdexcep;
  fd_set fdwrite;
  uint local_1e8;
  int local_1e4;
  char *local_1e0;
  long local_1d8;
  char *local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  sVar7 = strlen(url);
  pcVar8 = (char *)malloc(sVar7 + 5);
  tv_test_start = tutil_tvnow();
  if (pcVar8 == (char *)0x0) {
    test_cold_23();
    iVar5 = 0x1b;
  }
  else {
    easy[0] = (CURL *)0x0;
    easy[1] = (CURL *)0x0;
    easy[2] = (CURL *)0x0;
    sockets[0] = -1;
    sockets[1] = -1;
    sockets[2] = -1;
    res = 0;
    iVar5 = curl_global_init(3);
    if (iVar5 == 0) {
      iVar5 = res;
      if (res == 0) {
        lVar9 = curl_multi_init();
        if (lVar9 == 0) {
          test_cold_22();
        }
        else if (res == 0) {
          cVar17 = '\0';
          uVar14 = 0;
          local_1e0 = pcVar8;
          local_1d0 = url;
LAB_00102925:
          do {
            local_1d8 = -99;
            local_1e8 = 0xffffffff;
            cVar16 = cVar17;
            if (cVar17 == '\0') {
              pCVar10 = (CURL *)curl_easy_init();
              easy[(int)uVar14] = pCVar10;
              if (pCVar10 == (CURL *)0x0) {
                test_cold_21();
                res = 0x7c;
                pcVar8 = local_1e0;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              ppCVar2 = easy + (int)uVar14;
              if ((int)uVar14 % 3 == 2) {
                sprintf(local_1e0,"%s0200",local_1d0);
                iVar5 = curl_easy_setopt(*ppCVar2,0x6b,8);
                if (iVar5 != 0) {
                  test_cold_3();
                  pcVar8 = local_1e0;
                  res = iVar5;
                  break;
                }
              }
              else {
                sprintf(local_1e0,"%s0100",local_1d0);
                iVar5 = curl_easy_setopt(*ppCVar2,0x6b,1);
                if (iVar5 != 0) {
                  test_cold_2();
                  pcVar8 = local_1e0;
                  res = iVar5;
                  break;
                }
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x4a,1);
              if (iVar5 != 0) {
                test_cold_4();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x2712,local_1e0);
              if (iVar5 != 0) {
                test_cold_5();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x29,1);
              if (iVar5 != 0) {
                test_cold_6();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x50,1);
              if (iVar5 != 0) {
                test_cold_7();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x2715,"testuser:testpass");
              if (iVar5 != 0) {
                test_cold_8();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x4e2b,callback);
              if (iVar5 != 0) {
                test_cold_9();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x2711,ppCVar2);
              if (iVar5 != 0) {
                test_cold_10();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_easy_setopt(*ppCVar2,0x2a,1);
              if (iVar5 != 0) {
                test_cold_11();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              iVar5 = curl_multi_add_handle(lVar9,*ppCVar2);
              if (iVar5 != 0) {
                test_cold_12();
                pcVar8 = local_1e0;
                res = iVar5;
                break;
              }
              pcVar8 = local_1e0;
              if (res != 0) break;
              uVar14 = uVar14 + 1;
              cVar16 = '\x01';
            }
            iVar5 = curl_multi_perform(lVar9,&local_1e4);
            if (iVar5 != 0) {
              test_cold_13();
              pcVar8 = local_1e0;
              res = iVar5;
              break;
            }
            if (local_1e4 < 0) {
              pcVar8 = 
              "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
              ;
              uVar12 = 0x96;
LAB_00103013:
              fprintf(_stderr,pcVar8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,uVar12);
              pcVar8 = local_1e0;
              res = 0x7a;
              break;
            }
            pcVar8 = local_1e0;
            if (res != 0) break;
            tVar18 = tutil_tvnow();
            lVar13 = tutil_tvdiff(tVar18,tv_test_start);
            if (5000 < lVar13) {
              test_cold_20();
LAB_0010307b:
              pcVar8 = local_1e0;
              res = 0x7d;
              break;
            }
            pcVar8 = local_1e0;
            if ((res != 0) || ((cVar16 == '\x02' && (local_1e4 == 0)))) break;
            local_1b8.__fds_bits[0xe] = 0;
            local_1b8.__fds_bits[0xf] = 0;
            local_1b8.__fds_bits[0xc] = 0;
            local_1b8.__fds_bits[0xd] = 0;
            local_1b8.__fds_bits[10] = 0;
            local_1b8.__fds_bits[0xb] = 0;
            local_1b8.__fds_bits[8] = 0;
            local_1b8.__fds_bits[9] = 0;
            local_1b8.__fds_bits[6] = 0;
            local_1b8.__fds_bits[7] = 0;
            local_1b8.__fds_bits[4] = 0;
            local_1b8.__fds_bits[5] = 0;
            local_1b8.__fds_bits[2] = 0;
            local_1b8.__fds_bits[3] = 0;
            local_1b8.__fds_bits[0] = 0;
            local_1b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[0] = 0;
            local_b8.__fds_bits[1] = 0;
            local_b8.__fds_bits[2] = 0;
            local_b8.__fds_bits[3] = 0;
            local_b8.__fds_bits[4] = 0;
            local_b8.__fds_bits[5] = 0;
            local_b8.__fds_bits[6] = 0;
            local_b8.__fds_bits[7] = 0;
            local_b8.__fds_bits[8] = 0;
            local_b8.__fds_bits[9] = 0;
            local_b8.__fds_bits[10] = 0;
            local_b8.__fds_bits[0xb] = 0;
            local_b8.__fds_bits[0xc] = 0;
            local_b8.__fds_bits[0xd] = 0;
            local_b8.__fds_bits[0xe] = 0;
            local_b8.__fds_bits[0xf] = 0;
            local_138.__fds_bits[0] = 0;
            local_138.__fds_bits[1] = 0;
            local_138.__fds_bits[2] = 0;
            local_138.__fds_bits[3] = 0;
            local_138.__fds_bits[4] = 0;
            local_138.__fds_bits[5] = 0;
            local_138.__fds_bits[6] = 0;
            local_138.__fds_bits[7] = 0;
            local_138.__fds_bits[8] = 0;
            local_138.__fds_bits[9] = 0;
            local_138.__fds_bits[10] = 0;
            local_138.__fds_bits[0xb] = 0;
            local_138.__fds_bits[0xc] = 0;
            local_138.__fds_bits[0xd] = 0;
            local_138.__fds_bits[0xe] = 0;
            local_138.__fds_bits[0xf] = 0;
            iVar5 = curl_multi_fdset(lVar9,&local_1b8,&local_b8,&local_138,&local_1e8);
            if (iVar5 != 0) {
              test_cold_14();
              pcVar8 = local_1e0;
              res = iVar5;
              break;
            }
            if ((int)local_1e8 < -1) {
              pcVar8 = 
              "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
              uVar12 = 0xa3;
              goto LAB_00103013;
            }
            pcVar8 = local_1e0;
            if (res != 0) break;
            if ((int)local_1e8 < 0) {
              cVar17 = '\x02';
              if (cVar16 == '\x01') goto LAB_00102da2;
            }
            else {
              uVar1 = uVar14 - 1;
              uVar11 = 0;
              bVar4 = false;
              do {
                while (uVar6 = (uint)uVar11,
                      ((ulong)local_1b8.__fds_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
LAB_00102d69:
                  uVar11 = (ulong)(uVar6 + 1);
                  if (uVar6 == local_1e8) {
                    cVar17 = '\x02';
                    if (cVar16 != '\x01') goto LAB_00102daf;
                    if (!bVar4) {
                      test_cold_16();
                      cVar17 = '\x01';
                      goto LAB_00102925;
                    }
                    goto LAB_00102da2;
                  }
                }
                if (0 < (int)uVar14) {
                  lVar13 = 0;
                  do {
                    if (*(uint *)((long)sockets + lVar13) == uVar6) goto LAB_00102d69;
                    lVar13 = lVar13 + 4;
                  } while ((ulong)uVar14 << 2 != lVar13);
                }
                if (!(bool)(cVar16 == '\x01' & (bVar4 ^ 1U))) {
                  test_cold_15();
LAB_00102f34:
                  pcVar8 = local_1e0;
                  res = 0x7e;
                  goto LAB_00102f46;
                }
                uVar3 = sockets[(int)uVar1];
                if (uVar3 != 0xffffffff) {
                  if (uVar6 == uVar3) {
                    __assert_fail("curfd != sockets[num_handles-1]",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                                  ,0xc4,"int test(char *)");
                  }
                  fprintf(_stderr,"Handle %d wrote to socket %d then detected on %d\n",(ulong)uVar1,
                          (ulong)uVar3,uVar11);
                  goto LAB_00102f34;
                }
                sockets[(int)uVar1] = uVar6;
                bVar4 = true;
                uVar11 = (ulong)(uVar6 + 1);
              } while (uVar6 != local_1e8);
LAB_00102da2:
              cVar17 = (2 < (int)uVar14) * '\x02';
            }
LAB_00102daf:
            iVar5 = curl_multi_timeout(lVar9,&local_1d8);
            if (iVar5 != 0) {
              test_cold_17();
              pcVar8 = local_1e0;
              res = iVar5;
              break;
            }
            if (local_1d8 < -1) {
              fprintf(_stderr,
                      "%s:%d curl_multi_timeout() succeeded, but returned invalid timeout value (%ld)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                      ,0xdb,local_1d8);
              pcVar8 = local_1e0;
              res = 0x73;
              break;
            }
            pcVar8 = local_1e0;
            if (res != 0) break;
            fprintf(_stderr,"%s:%d num_handles %d timeout %ld\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/libntlmconnect.c"
                    ,0xe0,(ulong)uVar14);
            if (local_1d8 == -1) {
              local_1c8.tv_sec = 6;
              local_1c8.tv_usec = 0;
              pcVar8 = local_1e0;
              if (uVar14 == 3 && local_1e4 == 0) break;
            }
            else {
              local_1c8.tv_sec = local_1d8 / 1000;
              local_1c8.tv_usec = (local_1d8 % 1000) * 1000;
            }
            iVar5 = select_wrapper(local_1e8 + 1,&local_1b8,&local_b8,&local_138,&local_1c8);
            if (iVar5 == -1) {
              test_cold_19();
              pcVar8 = local_1e0;
              res = 0x79;
              break;
            }
            pcVar8 = local_1e0;
            if (res != 0) break;
            tVar18 = tutil_tvnow();
            lVar13 = tutil_tvdiff(tVar18,tv_test_start);
            if (5000 < lVar13) {
              test_cold_18();
              goto LAB_0010307b;
            }
            pcVar8 = local_1e0;
          } while (res == 0);
        }
LAB_00102f46:
        lVar13 = 0;
        do {
          lVar15 = *(long *)((long)easy + lVar13);
          if (lVar15 != 0) {
            if (lVar9 != 0) {
              curl_multi_remove_handle(lVar9);
              lVar15 = *(long *)((long)easy + lVar13);
            }
            curl_easy_cleanup(lVar15);
          }
          lVar13 = lVar13 + 8;
        } while (lVar13 != 0x18);
        if (lVar9 != 0) {
          curl_multi_cleanup(lVar9);
        }
        curl_global_cleanup();
        free(pcVar8);
        iVar5 = res;
      }
    }
    else {
      test_cold_1();
    }
  }
  return iVar5;
}

Assistant:

int test(char *url)
{
  CURLM *multi = NULL;
  int running;
  int i, j;
  int num_handles = 0;
  enum HandleState state = ReadyForNewHandle;
  char* full_url = malloc(strlen(url) + 4 + 1);

  start_test_timing();

  if (!full_url) {
    fprintf(stderr, "Not enough memory for full url\n");
    return CURLE_OUT_OF_MEMORY;
  }

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    easy[i] = NULL;
    sockets[i] = -1;
  }

  res = 0;
  res_global_init(CURL_GLOBAL_ALL);
  if(res) {
    return res;
  }

  multi_init(multi);

  for(;;) {
    struct timeval interval;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    long timeout = -99;
    curl_socket_t curfd, maxfd = INVALID_SOCKET;
    bool found_new_socket = FALSE;

    /* Start a new handle if we aren't at the max */
    if (state == ReadyForNewHandle) {
      easy_init(easy[num_handles]);

      if (num_handles % 3 == 2) {
        sprintf(full_url, "%s0200", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_NTLM);
      } else {
        sprintf(full_url, "%s0100", url);
        easy_setopt(easy[num_handles], CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
      }
      easy_setopt(easy[num_handles], CURLOPT_FRESH_CONNECT, 1L);
      easy_setopt(easy[num_handles], CURLOPT_URL, full_url);
      easy_setopt(easy[num_handles], CURLOPT_VERBOSE, 1L);
      easy_setopt(easy[num_handles], CURLOPT_HTTPGET, 1L);
      easy_setopt(easy[num_handles], CURLOPT_USERPWD, "testuser:testpass");
      easy_setopt(easy[num_handles], CURLOPT_WRITEFUNCTION, callback);
      easy_setopt(easy[num_handles], CURLOPT_WRITEDATA, easy + num_handles);
      easy_setopt(easy[num_handles], CURLOPT_HEADER, 1L);

      multi_add_handle(multi, easy[num_handles]);
      num_handles += 1;
      state = NeedSocketForNewHandle;
    }

    multi_perform(multi, &running);
    if (0 != res)
      break;

    abort_on_test_timeout();

    if(!running && state == NoMoreHandles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, (int *)&maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    /* Any socket which is new in fdread is associated with the new handle */
    for (curfd = 0; curfd <= maxfd; ++curfd) {
      bool socket_exists = FALSE;
      if (!FD_ISSET(curfd, &fdread)) {
        continue;
      }

      /* Check if this socket was already detected for an earlier handle (or
         for this handle, num_handles-1, in the callback */
      for (j = 0; j < num_handles; ++j) {
        if (sockets[j] == curfd) {
          socket_exists = TRUE;
          break;
        }
      }
      if (socket_exists) {
        continue;
      }

      if (found_new_socket || state != NeedSocketForNewHandle) {
        fprintf(stderr, "Unexpected new socket\n");
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }

      /* Now we know the socket is for the most recent handle, num_handles-1 */
      if (sockets[num_handles-1] != INVALID_SOCKET) {
        /* A socket for this handle was already detected in the callback; if it
           matched socket_exists should be true and we would never get here */
        assert(curfd != sockets[num_handles-1]);
        fprintf(stderr, "Handle %d wrote to socket %d then detected on %d\n",
                num_handles-1, sockets[num_handles-1], curfd);
        res = TEST_ERR_MAJOR_BAD;
        goto test_cleanup;
      }
      else {
        sockets[num_handles-1] = curfd;
        found_new_socket = TRUE;
        /* continue to make sure there's only one new handle */
      }
    }

    if (state == NeedSocketForNewHandle) {
      if(maxfd != -1 && !found_new_socket) {
        fprintf(stderr, "Warning: socket did not open immediately for new "
                "handle (trying again)\n");
        continue;
      }
      state = num_handles < MAX_EASY_HANDLES ? ReadyForNewHandle
                                             : NoMoreHandles;
    }

    multi_timeout(multi, &timeout);

    /* At this point, timeout is guaranteed to be greater or equal than -1. */

    fprintf(stderr, "%s:%d num_handles %d timeout %ld\n",
            __FILE__, __LINE__, num_handles, timeout);

    if(timeout != -1L) {
      interval.tv_sec = timeout/1000;
      interval.tv_usec = (timeout%1000)*1000;
    }
    else {
      interval.tv_sec = TEST_HANG_TIMEOUT/1000+1;
      interval.tv_usec = 0;

      /* if there's no timeout and we get here on the last handle, we may
         already have read the last part of the stream so waiting makes no
         sense */
      if(!running && num_handles == MAX_EASY_HANDLES) {
        break;
      }
    }

    select_test(maxfd+1, &fdread, &fdwrite, &fdexcep, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  for (i = 0; i < MAX_EASY_HANDLES; ++i) {
    if (easy[i]) {
       if (multi) {
         curl_multi_remove_handle(multi, easy[i]);
       }
       curl_easy_cleanup(easy[i]);
    }
  }

  if (multi) {
    curl_multi_cleanup(multi);
  }

  curl_global_cleanup();

  if (full_url) {
    free(full_url);
  }

  return res;
}